

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

bool __thiscall
QPDF::CopiedStreamDataProvider::provideStreamData
          (CopiedStreamDataProvider *this,QPDFObjGen *og,Pipeline *pipeline,bool suppress_warnings,
          bool will_retry)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  QPDF *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  mapped_type foreign_stream;
  shared_ptr<QPDF::ForeignStreamData> local_50;
  QPDFObjectHandle local_40;
  
  pmVar3 = std::
           map<QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>_>_>_>
           ::operator[](&this->foreign_stream_data,og);
  peVar1 = (pmVar3->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (pmVar3->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar1 == (element_type *)0x0) goto LAB_0013b8fa;
    this_01 = this->destination_qpdf;
    local_50.super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (peVar1 == (element_type *)0x0) {
LAB_0013b8fa:
      pmVar4 = std::
               map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
               ::operator[](&this->foreign_streams,og);
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pmVar4->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pmVar4->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      bVar2 = QPDFObjectHandle::pipeStreamData
                        (&local_40,pipeline,(bool *)0x0,0,qpdf_dl_none,suppress_warnings,will_retry)
      ;
      this_02._M_pi =
           local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      goto LAB_0013b97c;
    }
    this_01 = this->destination_qpdf;
    local_50.super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_50.super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  bVar2 = pipeForeignStreamData(this_01,&local_50,pipeline,suppress_warnings,will_retry);
  this_02._M_pi =
       local_50.super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
LAB_0013b97c:
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar2;
}

Assistant:

bool
QPDF::CopiedStreamDataProvider::provideStreamData(
    QPDFObjGen const& og, Pipeline* pipeline, bool suppress_warnings, bool will_retry)
{
    std::shared_ptr<ForeignStreamData> foreign_data = foreign_stream_data[og];
    bool result = false;
    if (foreign_data.get()) {
        result = destination_qpdf.pipeForeignStreamData(
            foreign_data, pipeline, suppress_warnings, will_retry);
        QTC::TC("qpdf", "QPDF copy foreign with data", result ? 0 : 1);
    } else {
        auto foreign_stream = foreign_streams[og];
        result = foreign_stream.pipeStreamData(
            pipeline, nullptr, 0, qpdf_dl_none, suppress_warnings, will_retry);
        QTC::TC("qpdf", "QPDF copy foreign with foreign_stream", result ? 0 : 1);
    }
    return result;
}